

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

ByteData *
cfd::core::TaprootUtil::CreateTapScriptControl
          (ByteData *__return_storage_ptr__,SchnorrPubkey *internal_pubkey,TapBranch *merkle_tree,
          SchnorrPubkey *witness_program,Script *locking_script)

{
  bool bVar1;
  Script local_140;
  SchnorrPubkey local_108;
  reference local_f0;
  ByteData256 *node;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range2;
  undefined1 local_a0 [8];
  Serializer builder;
  uint8_t top;
  SchnorrPubkey local_68;
  undefined1 local_50 [8];
  ByteData256 pubkey_data;
  bool parity;
  Script *locking_script_local;
  SchnorrPubkey *witness_program_local;
  TapBranch *merkle_tree_local;
  SchnorrPubkey *internal_pubkey_local;
  
  pubkey_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  TapBranch::GetTweakedPubkey
            (&local_68,merkle_tree,internal_pubkey,
             (bool *)((long)&pubkey_data.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  SchnorrPubkey::GetByteData256((ByteData256 *)local_50,&local_68);
  SchnorrPubkey::~SchnorrPubkey(&local_68);
  builder.offset_._3_1_ = TapBranch::GetLeafVersion(merkle_tree);
  if (builder.offset_._3_1_ == 0) {
    builder.offset_._3_1_ = 0xc0;
  }
  if ((pubkey_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    builder.offset_._3_1_ = builder.offset_._3_1_ | 1;
  }
  Serializer::Serializer((Serializer *)local_a0);
  Serializer::AddDirectByte((Serializer *)local_a0,builder.offset_._3_1_);
  SchnorrPubkey::GetData((ByteData *)&__range2,internal_pubkey);
  Serializer::AddDirectBytes((Serializer *)local_a0,(ByteData *)&__range2);
  ByteData::~ByteData((ByteData *)&__range2);
  (*merkle_tree->_vptr_TapBranch[4])(&__begin2);
  __end2 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      &__begin2);
  node = (ByteData256 *)
         ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                   ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                    &__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                *)&node);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
               ::operator*(&__end2);
    Serializer::AddDirectBytes((Serializer *)local_a0,local_f0);
    __gnu_cxx::
    __normal_iterator<cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
    ::operator++(&__end2);
  }
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)&__begin2);
  if (witness_program != (SchnorrPubkey *)0x0) {
    SchnorrPubkey::SchnorrPubkey(&local_108,(ByteData256 *)local_50);
    SchnorrPubkey::operator=(witness_program,&local_108);
    SchnorrPubkey::~SchnorrPubkey(&local_108);
  }
  if (locking_script != (Script *)0x0) {
    ScriptUtil::CreateTaprootLockingScript(&local_140,(ByteData256 *)local_50);
    Script::operator=(locking_script,&local_140);
    Script::~Script(&local_140);
  }
  Serializer::Output(__return_storage_ptr__,(Serializer *)local_a0);
  Serializer::~Serializer((Serializer *)local_a0);
  ByteData256::~ByteData256((ByteData256 *)local_50);
  return __return_storage_ptr__;
}

Assistant:

ByteData TaprootUtil::CreateTapScriptControl(
    const SchnorrPubkey& internal_pubkey, const TapBranch& merkle_tree,
    SchnorrPubkey* witness_program, Script* locking_script) {
  bool parity = false;
  auto pubkey_data =
      merkle_tree.GetTweakedPubkey(internal_pubkey, &parity).GetByteData256();
  uint8_t top = merkle_tree.GetLeafVersion();
  if (top == 0) top = TaprootScriptTree::kTapScriptLeafVersion;
  if (parity) top |= 0x01;
  Serializer builder;
  builder.AddDirectByte(top);
  builder.AddDirectBytes(internal_pubkey.GetData());
  for (const auto& node : merkle_tree.GetNodeList()) {
    builder.AddDirectBytes(node);
  }
  if (witness_program != nullptr) {
    *witness_program = SchnorrPubkey(pubkey_data);
  }
  if (locking_script != nullptr) {
    *locking_script = ScriptUtil::CreateTaprootLockingScript(pubkey_data);
  }
  return builder.Output();
}